

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_timer.cpp
# Opt level: O1

double I_GetTimeFrac(uint32 *ms)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  iVar1 = SDL_GetTicks();
  if (ms != (uint32 *)0x0) {
    *ms = TicStart + 0x1c;
  }
  if (TicStart == 0) {
    dVar3 = 1.0;
  }
  else {
    dVar2 = (double)((iVar1 - TicStart) * 0x23) / 1000.0;
    dVar3 = 1.0;
    if (dVar2 <= 1.0) {
      dVar3 = dVar2;
    }
    dVar3 = (double)(-(ulong)(0.0 < dVar2) & (ulong)dVar3);
  }
  return dVar3;
}

Assistant:

double I_GetTimeFrac (uint32 *ms)
{
	DWORD now = SDL_GetTicks ();
	if (ms) *ms = TicStart + (1000 / TICRATE);
	if (TicStart == 0)
	{
		return 1;
	}
	else
	{
		return clamp<double>((now - TicStart) * TICRATE / 1000., 0, 1);
	}
}